

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

string * __thiscall
duckdb::UpdateInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,UpdateInfo *this)

{
  UndoBufferEntry *pUVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  char cVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  size_type *psVar12;
  uint uVar13;
  ulong uVar14;
  undefined8 uVar15;
  idx_t index;
  string __str_2;
  string __str_1;
  string __str;
  UndoBufferReference next_pin;
  string local_160;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  string *local_e0;
  string local_d8;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  undefined1 local_78 [24];
  optional_ptr<duckdb::FileBuffer,_true> oStack_60;
  Val local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  LogicalType::ToString_abi_cxx11_(&local_d8,&this->segment->column_data->type);
  plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x1e4fca2);
  local_120 = &local_110;
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_110 = *plVar9;
    lStack_108 = plVar7[3];
  }
  else {
    local_110 = *plVar9;
    local_120 = (long *)*plVar7;
  }
  local_118 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_120);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_f0 = *puVar10;
    lStack_e8 = plVar7[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar10;
    local_100 = (ulong *)*plVar7;
  }
  local_f8 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->N;
  cVar6 = '\x01';
  if (9 < uVar2) {
    uVar13 = uVar2;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar13 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_017ae503;
      }
      if (uVar13 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_017ae503;
      }
      if (uVar13 < 10000) goto LAB_017ae503;
      bVar3 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar3);
    cVar6 = cVar6 + '\x01';
  }
LAB_017ae503:
  local_98 = local_88;
  ::std::__cxx11::string::_M_construct((ulong)&local_98,cVar6);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,local_90,uVar2);
  uVar14 = CONCAT44(uStack_8c,local_90) + local_f8;
  uVar11 = 0xf;
  if (local_100 != &local_f0) {
    uVar11 = local_f0;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_98 != local_88) {
      uVar11 = local_88[0];
    }
    if (uVar11 < uVar14) goto LAB_017ae57c;
    puVar8 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_100);
  }
  else {
LAB_017ae57c:
    puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_98);
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  psVar12 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160.field_2._8_8_ = puVar8[3];
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar12;
    local_160._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_160._M_string_length = puVar8[1];
  *puVar8 = psVar12;
  puVar8[1] = 0;
  *(undefined1 *)psVar12 = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_160);
  local_140 = &local_130;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_130 = *puVar10;
    lStack_128 = plVar7[3];
  }
  else {
    local_130 = *puVar10;
    local_140 = (ulong *)*plVar7;
  }
  local_138 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar14 = (this->version_number).super___atomic_base<unsigned_long>._M_i;
  cVar6 = '\x01';
  if (9 < uVar14) {
    uVar11 = uVar14;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar11 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_017ae69c;
      }
      if (uVar11 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_017ae69c;
      }
      if (uVar11 < 10000) goto LAB_017ae69c;
      bVar3 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar3);
    cVar6 = cVar6 + '\x01';
  }
LAB_017ae69c:
  local_b8 = local_a8;
  ::std::__cxx11::string::_M_construct((ulong)&local_b8,cVar6);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b8,local_b0,uVar14);
  uVar14 = CONCAT44(uStack_ac,local_b0) + local_138;
  uVar11 = 0xf;
  if (local_140 != &local_130) {
    uVar11 = local_130;
  }
  if (uVar11 < uVar14) {
    uVar11 = 0xf;
    if (local_b8 != local_a8) {
      uVar11 = local_a8[0];
    }
    if (uVar14 <= uVar11) {
      plVar7 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&local_b8,0,(char *)0x0,(ulong)local_140);
      goto LAB_017ae741;
    }
  }
  plVar7 = (long *)::std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_b8);
LAB_017ae741:
  local_78._0_8_ = local_78 + 0x10;
  pUVar1 = (UndoBufferEntry *)(plVar7 + 2);
  if ((UndoBufferEntry *)*plVar7 == pUVar1) {
    local_78._16_8_ = pUVar1->buffer_manager;
    oStack_60.ptr = (FileBuffer *)plVar7[3];
  }
  else {
    local_78._16_8_ = pUVar1->buffer_manager;
    local_78._0_8_ = (UndoBufferEntry *)*plVar7;
  }
  local_78._8_8_ = plVar7[1];
  *plVar7 = (long)pUVar1;
  plVar7[1] = 0;
  *(undefined1 *)&pUVar1->buffer_manager = 0;
  plVar7 = (long *)::std::__cxx11::string::append(local_78);
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    lVar4 = plVar7[3];
    local_38->_M_allocated_capacity = *psVar12;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((UndoBufferEntry *)local_78._0_8_ != (UndoBufferEntry *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_e0 = __return_storage_ptr__;
  if (this->N != 0) {
    index = 0;
    do {
      local_120 = &local_110;
      uVar2 = *(uint *)((long)&this[1].segment + index * 4);
      cVar6 = '\x01';
      if (9 < uVar2) {
        uVar13 = uVar2;
        cVar5 = '\x04';
        do {
          cVar6 = cVar5;
          if (uVar13 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_017ae926;
          }
          if (uVar13 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_017ae926;
          }
          if (uVar13 < 10000) goto LAB_017ae926;
          bVar3 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          cVar5 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_017ae926:
      ::std::__cxx11::string::_M_construct((ulong)&local_120,cVar6);
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_120,(uint)local_118,uVar2);
      puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_120);
      __return_storage_ptr__ = local_e0;
      local_100 = &local_f0;
      puVar10 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar10) {
        local_f0 = *puVar10;
        lStack_e8 = puVar8[3];
      }
      else {
        local_f0 = *puVar10;
        local_100 = (ulong *)*puVar8;
      }
      local_f8 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      GetValue((Value *)local_78,this,index);
      Value::ToString_abi_cxx11_((string *)&local_d8,(Value *)local_78);
      uVar14 = 0xf;
      if (local_100 != &local_f0) {
        uVar14 = local_f0;
      }
      if (uVar14 < local_d8._M_string_length + local_f8) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          uVar15 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_d8._M_string_length + local_f8) goto LAB_017aea16;
        puVar8 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_100);
      }
      else {
LAB_017aea16:
        puVar8 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_100,(ulong)local_d8._M_dataplus._M_p);
      }
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      psVar12 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_160.field_2._M_allocated_capacity = *psVar12;
        local_160.field_2._8_8_ = puVar8[3];
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar12;
        local_160._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_160._M_string_length = puVar8[1];
      *puVar8 = psVar12;
      puVar8[1] = 0;
      *(undefined1 *)psVar12 = 0;
      puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_160);
      local_140 = &local_130;
      puVar10 = puVar8 + 2;
      if ((ulong *)*puVar8 == puVar10) {
        local_130 = *puVar10;
        lStack_128 = puVar8[3];
      }
      else {
        local_130 = *puVar10;
        local_140 = (ulong *)*puVar8;
      }
      local_138 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_140);
      if (local_140 != &local_130) {
        operator_delete(local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      Value::~Value((Value *)local_78);
      if (local_100 != &local_f0) {
        operator_delete(local_100);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      index = index + 1;
    } while (index < this->N);
  }
  if ((this->next).entry != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin((UndoBufferReference *)local_78,&this->next);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&oStack_60);
    ToString_abi_cxx11_(&local_160,(UpdateInfo *)((oStack_60.ptr)->buffer + local_58[0].bigint));
    plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_160,0,(char *)0x0,0x1e4fccd);
    puVar10 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar10) {
      local_130 = *puVar10;
      lStack_128 = plVar7[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *puVar10;
      local_140 = (ulong *)*plVar7;
    }
    local_138 = plVar7[1];
    *plVar7 = (long)puVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
    BufferHandle::~BufferHandle((BufferHandle *)(local_78 + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

string UpdateInfo::ToString() {
	auto &type = segment->column_data.type;
	string result = "Update Info [" + type.ToString() + ", Count: " + to_string(N) +
	                ", Transaction Id: " + to_string(version_number) + "]\n";
	auto tuples = GetTuples();
	for (idx_t i = 0; i < N; i++) {
		result += to_string(tuples[i]) + ": " + GetValue(i).ToString() + "\n";
	}
	if (HasNext()) {
		auto next_pin = next.Pin();
		result += "\nChild Segment: " + Get(next_pin).ToString();
	}
	return result;
}